

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O1

_Bool project_p(source origin,wchar_t r,loc grid,wchar_t dam,wchar_t typ,wchar_t power,_Bool self)

{
  short sVar1;
  player *p;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  object *poVar6;
  monster_conflict *mon;
  char *fmt;
  int iVar7;
  anon_union_8_5_62f3dbed_for_which obj;
  char *pcVar8;
  int iVar9;
  trap *trap;
  int iVar10;
  bool bVar11;
  char killer [80];
  project_player_handler_context_t local_c8;
  monster_conflict *local_98;
  project_player_handler_f local_90;
  char local_88 [88];
  
  obj = origin.which;
  sVar1 = player->timed[2];
  bVar11 = sVar1 == 0;
  local_90 = player_handlers[typ];
  local_c8.power = power;
  local_c8.obvious = true;
  local_c8.origin.what = origin.what;
  local_c8.origin.which = obj;
  local_c8.r = r;
  local_c8.grid = grid;
  local_c8.dam = dam;
  local_c8.type = typ;
  _Var2 = square_isdecoyed(cave,grid);
  if ((_Var2) && (local_c8.dam != L'\0')) {
    square_destroy_decoy(cave,grid);
  }
  _Var2 = square_isplayer(cave,grid);
  if (!_Var2) {
    return false;
  }
  _Var2 = square_isprotect(cave,grid);
  if (_Var2) {
    _Var2 = square_isrubble(cave,grid);
    if ((_Var2) && (uVar3 = Rand_div(10), uVar3 == 0)) {
      pcVar8 = "You duck behind a boulder!";
LAB_001c908e:
      msg(pcVar8);
      return false;
    }
    _Var2 = square_istree(cave,grid);
    if (((_Var2) && (uVar3 = Rand_div(8), uVar3 == 0)) &&
       ((_Var2 = flag_has_dbg((player->state).pflags,10,0x30,"player->state.pflags","(PF_WOODSMAN)")
        , _Var2 ||
        (_Var2 = flag_has_dbg((player->state).pflags,10,0x16,"player->state.pflags","(PF_ELVEN)"),
        _Var2)))) {
      pcVar8 = "You dodge behind a tree!";
      goto LAB_001c908e;
    }
  }
  switch(origin.what) {
  case SRC_NONE:
  case SRC_GRID:
    pcVar8 = "a bug";
    goto LAB_001c8cca;
  case SRC_TRAP:
    pcVar8 = ((ego_item *)(obj.trap)->kind)->text;
    fmt = "a %s";
    goto LAB_001c8d33;
  case SRC_PLAYER:
    if (!self) {
      return false;
    }
    pcVar8 = "yourself";
LAB_001c8cca:
    my_strcpy(local_88,pcVar8,0x50);
    break;
  case SRC_MONSTER:
    mon = (monster_conflict *)cave_monster(cave,origin.which._0_4_);
    _Var2 = monster_is_visible((monster *)mon);
    bVar11 = _Var2 && sVar1 == 0;
    monster_desc(local_88,0x50,(monster *)mon,L'\x88');
    update_smart_learn(mon,player,L'\0',L'\0',typ);
    goto LAB_001c8d4b;
  case SRC_OBJECT:
    object_desc(local_88,0x50,obj.object,0x40,player);
    break;
  case SRC_CHEST_TRAP:
    pcVar8 = (obj.chest_trap)->msg_death;
    fmt = "%s";
LAB_001c8d33:
    strnfmt(local_88,0x50,fmt,pcVar8);
  }
  mon = (monster_conflict *)0x0;
LAB_001c8d4b:
  p = player;
  if (mon != (monster_conflict *)0x0 && typ == L'\x1b') {
    iVar7 = (player->state).to_a + (player->state).ac;
    local_98 = mon;
    wVar4 = slot_by_name(player,"arm");
    poVar6 = slot_object(p,wVar4);
    iVar10 = 0;
    if (poVar6 != (object *)0x0) {
      iVar10 = (int)poVar6->ac;
    }
    iVar9 = 0;
    if ((player->state).shield_on_back == false) {
      _Var2 = flag_has_dbg((player->state).pflags,10,0x33,"player->state.pflags","(PF_SHIELD_MAST)")
      ;
      iVar9 = iVar10 + 3;
      if (!_Var2) {
        iVar9 = iVar10;
      }
    }
    wVar5 = Rand_div(0x50);
    wVar4 = (player->state).evasion_chance;
    if (wVar5 < wVar4) {
      msg("You evade the missile!");
      disturb(player);
    }
    else {
      iVar10 = 0x96;
      if (iVar7 < 0x96) {
        iVar10 = iVar7;
      }
      uVar3 = Rand_div(local_98->race->level * 0x14 + 200);
      if ((int)(uVar3 + 1) < iVar10) {
        msg("The missile glances off your armour.");
      }
      else {
        uVar3 = Rand_div(0x78);
        if ((int)uVar3 < iVar9) {
          msg("The missile ricochets off your shield.");
        }
      }
    }
    if (wVar5 < wVar4) {
      return true;
    }
  }
  if (!bVar11) {
    msg("You are hit by %s!");
  }
  local_c8.dam = terrain_adjust_dam(player,(monster_conflict *)0x0,typ,local_c8.dam);
  local_c8.dam = adjust_dam(player,typ,local_c8.dam,true);
  if (local_c8.dam != L'\0') {
    if (self) {
      local_c8.dam = local_c8.dam / 10;
    }
    wVar4 = player_apply_damage_reduction(player,local_c8.dam);
    if ((L'\0' < wVar4) && ((player->opts).opt[3] == true)) {
      msg("You take %d damage.",(ulong)(uint)wVar4);
    }
    take_hit(player,wVar4,local_88);
  }
  if ((typ != L'>') && (player->is_dead == false)) {
    wVar4 = (*local_90)(&local_c8);
    wVar4 = player_apply_damage_reduction(player,wVar4);
    if ((L'\0' < wVar4) && ((player->opts).opt[3] == true)) {
      msg("You take an extra %d damage.",(ulong)(uint)wVar4);
    }
    take_hit(player,wVar4,local_88);
  }
  disturb(player);
  return local_c8.obvious;
}

Assistant:

bool project_p(struct source origin, int r, struct loc grid, int dam, int typ,
			   int power, bool self)
{
	bool blind = (player->timed[TMD_BLIND] ? true : false);
	bool seen = !blind;
	bool obvious = true;
	struct monster *mon = NULL;

	/* Monster or trap name (for damage) */
	char killer[80];

	project_player_handler_f player_handler = player_handlers[typ];
	project_player_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		power,
		obvious
	};

	/* Decoy has been hit */
	if (square_isdecoyed(cave, grid) && context.dam) {
		square_destroy_decoy(cave, grid);
	}

	/* No player here */
	if (!square_isplayer(cave, grid)) {
		return false;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		/* A player behind rubble can duck. */
		if (square_isrubble(cave, grid) && one_in_(10)) {
			msg("You duck behind a boulder!");
			return false;
		}

		/* Rangers, elves and druids can take cover in trees. */
		if (square_istree(cave, grid) && one_in_(8) &&
			(player_has(player, PF_WOODSMAN) || player_has(player, PF_ELVEN))) {
			msg("You dodge behind a tree!");
			return false;
		}
	}

	switch (origin.what) {
		case SRC_PLAYER: {
			/* Don't affect projector unless explicitly allowed */
			if (!self) return false;
			/* Use the same message as the DAMAGE handler. */
			my_strcpy(killer, "yourself", sizeof(killer));
			break;
		}

		case SRC_MONSTER: {
			mon = cave_monster(cave, origin.which.monster);

			/* Check it is visible */
			if (!monster_is_visible(mon))
				seen = false;

			/* Get the monster's real name */
			monster_desc(killer, sizeof(killer), mon, MDESC_DIED_FROM);

			/* Monster sees what is going on */
			update_smart_learn(mon, player, 0, 0, typ);

			break;
		}

		case SRC_TRAP: {
			struct trap *trap = origin.which.trap;

			/* Get the trap name */
			strnfmt(killer, sizeof(killer), "a %s", trap->kind->desc);

			break;
		}

		case SRC_OBJECT: {
			struct object *obj = origin.which.object;
			object_desc(killer, sizeof(killer), obj,
				ODESC_PREFIX | ODESC_BASE, player);
			break;
		}

		case SRC_CHEST_TRAP: {
			struct chest_trap *trap = origin.which.chest_trap;

			/* Get the trap name */
			strnfmt(killer, sizeof(killer), "%s", trap->msg_death);

			break;
		}

		case SRC_GRID:
		case SRC_NONE: {
			/* Use the same message as the DAMAGE handler. */
			my_strcpy(killer, "a bug", sizeof(killer));
			break;
		}
		default: break;
	}

	/* Try to evade or deflect missiles */
	if ((typ == ELEM_ARROW) && mon) {
		/* Get effective armor values */
		int armor = player->state.ac + player->state.to_a;
		struct object *shld = slot_object(player, slot_by_name(player, "arm"));
		int shield_ac = shld ? shld->ac : 0;
		if (player->state.shield_on_back) {
			shield_ac = 0;
		} else if (player_has(player, PF_SHIELD_MAST)) {
			shield_ac += 3;
		}

		if (randint1(80) <= player->state.evasion_chance) {
			/* Evasion */
			msg("You evade the missile!");
			disturb(player);
			return true;
		} else if (MIN(armor, 150) > randint1((10 + mon->race->level) * 20)) {
			/* Armor deflection */
			msg("The missile glances off your armour.");
		} else if (shield_ac > randint0(20 * 6)) {
			/* Shield deflection (20 is max shield AC) */
			msg("The missile ricochets off your shield.");
		}
	}

	/* Let player know what is going on */
	if (!seen) {
		msg("You are hit by %s!", projections[typ].blind_desc);
	}

	/* Adjust damage for terrain and element properties, and apply it */
	context.dam = terrain_adjust_dam(player, NULL, typ, context.dam);
	context.dam = adjust_dam(player, typ, context.dam, true);
	if (context.dam) {
		int reduced;

		/* Self-inflicted damage is scaled down */
		if (self) {
			context.dam /= 10;
		}
		/*
		 * Account for the player's damage reduction.   That does not
		 * affect the side effects (i.e. player_handler), so leave
		 * context.dam unmodified.
		 */
		reduced = player_apply_damage_reduction(player, context.dam);
		if (reduced > 0 && OPT(player, show_damage)) {
			msg("You take %d damage.", reduced);
		}
		take_hit(player, reduced, killer);
	}

	/* Handle side effects, possibly including extra damage */
	if (player_handler != NULL && player->is_dead == false) {
		int xtra = player_handler(&context);

		xtra = player_apply_damage_reduction(player, xtra);
		if (xtra > 0 && OPT(player, show_damage)) {
			msg("You take an extra %d damage.", xtra);
		}
		take_hit(player, xtra, killer);
	}

	/* Disturb */
	disturb(player);

	/* Return "Anything seen?" */
	return context.obvious;
}